

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

ON_ScaleValue *
ON_ScaleValue::Create
          (ON_ScaleValue *__return_storage_ptr__,ON_LengthValue *left_side_length,
          ON_LengthValue *right_side_length,ScaleStringFormat string_format_preference)

{
  ON_LengthValue *this;
  ON_LengthValue *this_00;
  ON_UnitSystem *this_01;
  ON_UnitSystem *this_02;
  bool bVar1;
  LengthUnitSystem context_unit_system;
  LengthUnitSystem context_unit_system_00;
  ON_ScaleValue *pOVar2;
  wchar_t *pwVar3;
  double *y_00;
  wchar_t *pwVar4;
  double *x_00;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double y;
  double x;
  double local_38;
  
  ON_ScaleValue(__return_storage_ptr__,&Unset);
  this = &__return_storage_ptr__->m_left_length;
  ON_LengthValue::operator=(this,left_side_length);
  this_00 = &__return_storage_ptr__->m_right_length;
  ON_LengthValue::operator=(this_00,right_side_length);
  __return_storage_ptr__->m_string_format_preference = string_format_preference;
  bVar1 = ON_LengthValue::IsUnset(this);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  bVar1 = ON_LengthValue::IsUnset(this_00);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  this_01 = &(__return_storage_ptr__->m_left_length).m_length_unit_system;
  context_unit_system = ON_UnitSystem::UnitSystem(this_01);
  this_02 = &(__return_storage_ptr__->m_right_length).m_length_unit_system;
  context_unit_system_00 = ON_UnitSystem::UnitSystem(this_02);
  dVar6 = ON_LengthValue::Length(this,context_unit_system);
  dVar7 = ON_LengthValue::Length(this_00,context_unit_system_00);
  if ((dVar6 <= 0.0) || (dVar7 <= 0.0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x5c5,"","Invalid input");
    return __return_storage_ptr__;
  }
  dVar8 = ON::UnitScale(this_01,this_02);
  dVar9 = ON::UnitScale(this_02,this_01);
  if ((dVar8 <= 0.0) || (dVar9 <= 0.0)) {
LAB_005ca956:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x5e6,"","Invalid input");
    return __return_storage_ptr__;
  }
  local_38 = dVar9;
  dVar9 = ON_InternalDefuzz(1e-14,dVar8 * dVar9);
  if ((dVar9 != 1.0) || (NAN(dVar9))) goto LAB_005ca956;
  y = dVar7;
  if (dVar8 <= local_38) {
    if (dVar8 < local_38) {
      y = dVar7 * local_38;
    }
  }
  else {
    dVar6 = dVar6 * dVar8;
  }
  x = dVar6;
  if ((dVar6 <= 0.0) || (y <= 0.0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x5f5,"","Invalid input");
    return __return_storage_ptr__;
  }
  dVar7 = 1.0;
  if ((ABS(dVar6 / y + -1.0) <= 1e-14) || (ABS(y / dVar6 + -1.0) <= 1e-14)) {
    dVar8 = 1.0;
  }
  else {
    if (y <= dVar6) {
      if (y < dVar6) {
        y_00 = &x;
        x_00 = &y;
        dVar7 = y;
        goto LAB_005caac3;
      }
    }
    else {
      y_00 = &y;
      x_00 = &x;
      dVar7 = dVar6;
LAB_005caac3:
      ON_Internal_RemoveCommonFactors(dVar7,dVar6,x_00,y_00);
    }
    for (lVar5 = 0; dVar8 = x, lVar5 != 0x18; lVar5 = lVar5 + 8) {
      ON_Internal_RemoveCommonFactors(*(double *)((long)&DAT_006c6ce0 + lVar5),dVar6,&y,&x);
    }
    dVar6 = floor(x);
    dVar7 = y;
    if ((dVar8 != dVar6) || (NAN(dVar8) || NAN(dVar6))) {
      string_format_preference = EquationFormat;
    }
    else {
      dVar6 = floor(y);
      if (dVar7 != dVar6) {
        string_format_preference = EquationFormat;
      }
      if (NAN(dVar7) || NAN(dVar6)) {
        string_format_preference = EquationFormat;
      }
    }
  }
  dVar6 = ON_InternalQuotient(0.0,dVar8,dVar7);
  __return_storage_ptr__->m_left_to_right_scale = dVar6;
  dVar9 = ON_InternalQuotient(0.0,dVar7,dVar8);
  __return_storage_ptr__->m_right_to_left_scale = dVar9;
  dVar6 = __return_storage_ptr__->m_left_to_right_scale;
  dVar10 = floor(dVar6);
  if (((dVar6 < 2.0) || (dVar10 != dVar6)) || (NAN(dVar10) || NAN(dVar6))) {
    dVar6 = floor(dVar9);
    if (2.0 <= dVar9) {
      if ((dVar6 == dVar9) && (pOVar2 = __return_storage_ptr__, !NAN(dVar6) && !NAN(dVar9)))
      goto LAB_005cabf6;
    }
  }
  else {
    pOVar2 = (ON_ScaleValue *)&__return_storage_ptr__->m_right_to_left_scale;
    dVar9 = dVar6;
LAB_005cabf6:
    pOVar2->m_left_to_right_scale = 1.0 / dVar9;
  }
  if (string_format_preference == FractionFormat) {
    pwVar4 = L"%.17g/%.17g";
  }
  else {
    if (string_format_preference != RatioFormat) {
      pwVar4 = ON_LengthValue::LengthAsStringPointer(this);
      pwVar3 = ON_LengthValue::LengthAsStringPointer(this_00);
      ON_wString::Format(&__return_storage_ptr__->m_scale_as_string,L"%ls = %ls",pwVar4,pwVar3);
      goto LAB_005cac64;
    }
    pwVar4 = L"%.17g:%.17g";
  }
  ON_wString::Format(&__return_storage_ptr__->m_scale_as_string,pwVar4,dVar8,dVar7);
LAB_005cac64:
  __return_storage_ptr__->m_string_format_preference = string_format_preference;
  return __return_storage_ptr__;
}

Assistant:

ON_ScaleValue ON_ScaleValue::Create(
  const class ON_LengthValue& left_side_length,
  const class ON_LengthValue& right_side_length,
  ON_ScaleValue::ScaleStringFormat string_format_preference
)
{
  ON_ScaleValue scale_value = ON_ScaleValue::Unset;

  scale_value.m_left_length = left_side_length;
  scale_value.m_right_length = right_side_length;
  scale_value.m_string_format_preference = string_format_preference;

  if (scale_value.m_left_length.IsUnset() || scale_value.m_right_length.IsUnset())
    return scale_value;

  ON::LengthUnitSystem left_length_unit_system = scale_value.m_left_length.LengthUnitSystem().UnitSystem();
  ON::LengthUnitSystem right_length_unit_system = scale_value.m_right_length.LengthUnitSystem().UnitSystem();
  const double left_length = scale_value.m_left_length.Length(left_length_unit_system);
  const double right_length = scale_value.m_right_length.Length(right_length_unit_system);
  if (false == (left_length > 0.0 && right_length > 0.0))
  {
    // one or both of left_length and right_length is a NAN or negative
    ON_ERROR("Invalid input");
    return scale_value;
  }

  // Dale Lear http://mcneel.myjetbrains.com/youtrack/issue/RH-34709
  // Turns out that stripping unit system information when one side is None
  // was a bad idea. After using ON_ScaleValue in the ON_DimStyle
  // class, preserving the unit systems works better when one
  // is None.
  ////if (ON::LengthUnitSystem::None == left_length_unit_system
  ////  && ON::LengthUnitSystem::None != right_length_unit_system
  ////  )
  ////{
  ////  // remove units from right side 
  ////  scale_value.m_right_length = scale_value.m_right_length.RemoveUnitSystem();
  ////  right_length_unit_system = ON::LengthUnitSystem::None;
  ////}

  ////if (ON::LengthUnitSystem::None != left_length_unit_system
  ////  && ON::LengthUnitSystem::None == right_length_unit_system
  ////  )
  ////{
  ////  // remove units from left side 
  ////  scale_value.m_left_length = scale_value.m_left_length.RemoveUnitSystem();
  ////  left_length_unit_system = ON::LengthUnitSystem::None;
  ////}

  const double left_to_right_scale = ON::UnitScale(scale_value.m_left_length.LengthUnitSystem(), scale_value.m_right_length.LengthUnitSystem());
  const double right_to_left_scale = ON::UnitScale(scale_value.m_right_length.LengthUnitSystem(), scale_value.m_left_length.LengthUnitSystem());

  if (false == (left_to_right_scale > 0.0 && right_to_left_scale > 0.0 && 1.0 == ON_InternalDefuzz(1.0e-14,left_to_right_scale*right_to_left_scale)) )
  {
    // one or both of left_to_right_scale and right_to_left_scale is a NAN or not set correctly
    ON_ERROR("Invalid input");
    ON_InternalDefuzz(1.0e-14, left_to_right_scale*right_to_left_scale);
    return scale_value;
  }
  
  double x = left_length;
  double y = right_length;
  if (left_to_right_scale > right_to_left_scale)
    x *= left_to_right_scale;
  else if ( right_to_left_scale > left_to_right_scale)
    y *= right_to_left_scale;

  if (false == (x > 0.0 && y > 0.0))
  {
    // one or both of x and y is a NAN or not set correctly
    ON_ERROR("Invalid input");
    return scale_value;
  }

  if (!ON_Internal_SimplifyRatio(x, y))
    string_format_preference = ON_ScaleValue::ScaleStringFormat::EquationFormat;

  scale_value.m_left_to_right_scale = ON_InternalQuotient(0.0,x,y);
  scale_value.m_right_to_left_scale = ON_InternalQuotient(0.0,y,x);

  if (scale_value.m_left_to_right_scale >= 2.0 && floor(scale_value.m_left_to_right_scale) == scale_value.m_left_to_right_scale)
  {
    scale_value.m_right_to_left_scale = 1.0 / scale_value.m_left_to_right_scale;
  }
  else if (scale_value.m_right_to_left_scale >= 2.0 && floor(scale_value.m_right_to_left_scale) == scale_value.m_right_to_left_scale)
  {
    scale_value.m_left_to_right_scale = 1.0 / scale_value.m_right_to_left_scale;
  }

  switch (string_format_preference)
  {
  case ON_ScaleValue::ScaleStringFormat::RatioFormat:
    // Do NOT dumb down the %.17g in the format string.
    // If you don't like the format, then make your own string and call
    // ON_ScaleValue::CreateFromString(). It is critical that 
    // the values in the formatted string exactly match the double values.
    scale_value.m_scale_as_string.Format(L"%.17g:%.17g", x, y);
    break;
  case ON_ScaleValue::ScaleStringFormat::FractionFormat:
    // Do NOT dumb down the %.17g in the format string.
    // If you don't like the format, then make your own string and call
    // ON_ScaleValue::CreateFromString(). It is critical that 
    // the values in the formatted string exactly match the double values.
    scale_value.m_scale_as_string.Format(L"%.17g/%.17g", x, y);
    break;
  case ON_ScaleValue::ScaleStringFormat::EquationFormat:
    // no break here
  default:
    scale_value.m_scale_as_string.Format(L"%ls = %ls",
      scale_value.m_left_length.LengthAsStringPointer(), 
      scale_value.m_right_length.LengthAsStringPointer()
    );
    break;
  }

  scale_value.m_string_format_preference = string_format_preference;


  return scale_value;
}